

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Dropout::forward_impl
          (Dropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Tensor *pTVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  uint uVar13;
  Index size;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  Index index_1;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  Tensor m;
  Tensor local_68;
  
  local_68.v = (float *)(this->super_Node).aux_mem;
  local_68.d.bd = (this->super_Node).dim.bd;
  local_68.d.d._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_68.d.d._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_68.d.d._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_68.d._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar20 = 1.0 - this->p;
  TensorTools::RandomBernoulli(&local_68,fVar20,1.0 / fVar20);
  pTVar4 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar16 = (ulong)(pTVar4->d).nd;
  iVar14 = 1;
  iVar12 = 1;
  if (uVar16 != 0) {
    uVar15 = 0;
    do {
      iVar12 = iVar12 * (pTVar4->d).d[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  if ((ulong)local_68.d._24_8_ >> 0x20 != 0) {
    iVar14 = 1;
    uVar16 = 0;
    do {
      iVar14 = iVar14 * local_68.d.d[uVar16];
      uVar16 = uVar16 + 1;
    } while ((ulong)local_68.d._24_8_ >> 0x20 != uVar16);
  }
  if (iVar12 * (pTVar4->d).bd == iVar14 * local_68.d.bd) {
    uVar16 = (ulong)(fx->d).nd;
    iVar12 = 1;
    if (uVar16 != 0) {
      uVar15 = 0;
      do {
        iVar12 = iVar12 * (fx->d).d[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
    uVar13 = iVar12 * (fx->d).bd;
    uVar16 = (ulong)uVar13;
    if (uVar13 == iVar14 * local_68.d.bd) {
      pfVar5 = fx->v;
      uVar15 = uVar16;
      if ((((ulong)pfVar5 & 3) == 0) &&
         (uVar15 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 3), uVar16 <= uVar15)) {
        uVar15 = uVar16;
      }
      pfVar6 = pTVar4->v;
      uVar18 = uVar16 - uVar15;
      uVar17 = uVar18 + 3;
      if (-1 < (long)uVar18) {
        uVar17 = uVar18;
      }
      if (uVar15 != 0) {
        uVar19 = 0;
        do {
          pfVar5[uVar19] = pfVar6[uVar19] * local_68.v[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar15 != uVar19);
      }
      uVar17 = (uVar17 & 0xfffffffffffffffc) + uVar15;
      if (3 < (long)uVar18) {
        do {
          pfVar1 = pfVar6 + uVar15;
          fVar20 = pfVar1[1];
          fVar7 = pfVar1[2];
          fVar8 = pfVar1[3];
          pfVar2 = local_68.v + uVar15;
          fVar9 = pfVar2[1];
          fVar10 = pfVar2[2];
          fVar11 = pfVar2[3];
          pfVar3 = pfVar5 + uVar15;
          *pfVar3 = *pfVar2 * *pfVar1;
          pfVar3[1] = fVar9 * fVar20;
          pfVar3[2] = fVar10 * fVar7;
          pfVar3[3] = fVar11 * fVar8;
          uVar15 = uVar15 + 4;
        } while ((long)uVar15 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar16) {
        do {
          pfVar5[uVar17] = pfVar6[uVar17] * local_68.v[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_68.bs);
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Dropout::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomBernoulli(m, (1.f-p), 1.f / (1.f-p));
#ifdef HAVE_CUDA
  gpu::vcwise_product(fx.d.size(), xs[0]->v, m.v, fx.v);
#else
  fx.vec() = xs[0]->vec().cwiseProduct(m.vec());
#endif
}